

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall
Fifteen::drawNumberOnTile
          (Fifteen *this,QIcon *icon,QPixmap *pixmap,size_t fontSize,size_t number,
          NumberColor numberColor)

{
  char16_t *pcVar1;
  short sVar2;
  QByteArrayView QVar3;
  QPainter painter;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  qsizetype local_58;
  QString local_48;
  
  QPainter::QPainter((QPainter *)local_80,(QPaintDevice *)pixmap);
  QVar3.m_data = (storage_type *)0x5;
  QVar3.m_size = (qsizetype)local_68;
  QString::fromUtf8(QVar3);
  local_48.d.d = (Data *)local_68._0_8_;
  local_48.d.ptr = (char16_t *)local_68._8_8_;
  local_48.d.size = local_58;
  QFont::QFont((QFont *)local_78,&local_48,(int)fontSize,700,false);
  QPainter::setFont((QFont *)local_80);
  QFont::~QFont((QFont *)local_78);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  pcVar1 = local_48.d.ptr;
  sVar2 = -(ushort)(numberColor == WHITE);
  local_48.d.d = (Data *)CONCAT26(sVar2,0xffff00000001);
  local_48.d.ptr._6_2_ = SUB82(pcVar1,6);
  local_48.d.ptr._0_6_ = (uint6)CONCAT22(sVar2,sVar2);
  QPainter::setPen((QColor *)local_80);
  local_78 = QPixmap::rect();
  QString::number((ulong)local_68,(int)number + 1);
  QPainter::drawText((QRect *)local_80,(int)local_78,(QString *)0x84,(QRect *)local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,8);
    }
  }
  QIcon::addPixmap(icon,pixmap,0,1);
  QPainter::end();
  QPainter::~QPainter((QPainter *)local_80);
  return;
}

Assistant:

void Fifteen::drawNumberOnTile( QIcon& icon, QPixmap& pixmap, size_t fontSize, size_t number, NumberColor numberColor )
{
    QPainter painter( &pixmap );
    painter.setFont( QFont( "Times", fontSize, QFont::Bold ));
    QColor color = numberColor == NumberColor::WHITE ? QColor( 255, 255, 255 ) : QColor( 0, 0, 0 );
    painter.setPen( color );
    painter.drawText( pixmap.rect(), Qt::AlignCenter, QString::number( number + 1 ));
    icon.addPixmap( pixmap );
    painter.end();
}